

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteMaterials(ColladaExporter *this)

{
  undefined1 *puVar1;
  Surface *pSurface;
  string *name_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Surface *pSVar3;
  size_t __n;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  pointer pcVar10;
  bool bVar11;
  aiReturn aVar12;
  int iVar13;
  aiScene *paVar14;
  undefined8 *puVar15;
  size_t sVar16;
  long *plVar17;
  ostream *poVar18;
  undefined4 uVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  *this_00;
  ulong *puVar26;
  string *psVar27;
  ulong uVar28;
  long lVar29;
  Property *pProperty;
  pointer pMVar30;
  string testName;
  aiMaterialProperty *prop;
  aiString name;
  ulong *local_660;
  long local_658;
  ulong local_650 [2];
  long *local_640;
  undefined8 local_638;
  long local_630;
  undefined8 uStack_628;
  ulong *local_620;
  long local_618;
  ulong local_610 [2];
  Surface *local_600;
  ulong *local_5f8;
  size_t local_5f0;
  ulong local_5e8;
  long lStack_5e0;
  ColladaExporter *local_5d8;
  Surface *local_5d0;
  Surface *local_5c8;
  Surface *local_5c0;
  Surface *local_5b8;
  string local_5b0 [3];
  ios_base local_540 [264];
  undefined1 local_438 [1032];
  
  this_00 = &this->materials;
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::resize(this_00,(ulong)this->mScene->mNumMaterials);
  paVar14 = this->mScene;
  if (paVar14->mNumMaterials != 0) {
    lVar25 = 0;
    lVar29 = 0;
    uVar28 = 0;
    local_5d8 = this;
    do {
      pSVar3 = (Surface *)paVar14->mMaterials[uVar28];
      local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
      memset(local_438 + 5,0x1b,0x3ff);
      local_600 = pSVar3;
      aVar12 = aiGetMaterialString((aiMaterial *)pSVar3,"?mat.name",0,0,(aiString *)local_438);
      if (aVar12 == aiReturn_SUCCESS) {
        pcVar22 = local_438 + 4;
        local_5f8 = &local_5e8;
        sVar16 = strlen(pcVar22);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5f8,pcVar22,pcVar22 + sVar16);
        sVar16 = local_5f0;
        puVar26 = local_5f8;
        if (uVar28 == 0) {
          lVar24 = 0;
        }
        else {
          pMVar30 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar23 = 0;
          lVar24 = 0;
          do {
            __n = *(size_t *)((long)&(pMVar30->name)._M_string_length + lVar23);
            if (__n == sVar16) {
              if (__n == 0) {
                uVar20 = 1;
              }
              else {
                iVar13 = bcmp(*(void **)((long)&(pMVar30->name)._M_dataplus._M_p + lVar23),puVar26,
                              __n);
                uVar20 = (ulong)(iVar13 == 0);
              }
            }
            else {
              uVar20 = 0;
            }
            lVar24 = lVar24 + uVar20;
            lVar23 = lVar23 + 0x218;
          } while (lVar25 != lVar23);
        }
        if (lVar24 == 0) {
          pMVar30 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pcVar22 = (char *)pMVar30[uVar28].name._M_string_length;
          strlen(local_438 + 4);
          std::__cxx11::string::_M_replace
                    ((ulong)(pMVar30 + uVar28),0,pcVar22,(ulong)(local_438 + 4));
        }
        else {
          pcVar22 = local_438 + 4;
          local_620 = local_610;
          sVar16 = strlen(pcVar22);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_620,pcVar22,pcVar22 + sVar16);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
          std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
          std::ios_base::~ios_base(local_540);
          uVar20 = 0xf;
          if (local_620 != local_610) {
            uVar20 = local_610[0];
          }
          if (uVar20 < (ulong)(local_658 + local_618)) {
            uVar20 = 0xf;
            if (local_660 != local_650) {
              uVar20 = local_650[0];
            }
            if (uVar20 < (ulong)(local_658 + local_618)) goto LAB_0031961d;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_660,0,(char *)0x0,(ulong)local_620);
          }
          else {
LAB_0031961d:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_660);
          }
          plVar17 = puVar15 + 2;
          if ((long *)*puVar15 == plVar17) {
            local_630 = *plVar17;
            uStack_628 = puVar15[3];
            local_640 = &local_630;
          }
          else {
            local_630 = *plVar17;
            local_640 = (long *)*puVar15;
          }
          local_638 = puVar15[1];
          *puVar15 = plVar17;
          puVar15[1] = 0;
          *(undefined1 *)plVar17 = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     ((this_00->
                      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar28),(string *)&local_640);
          if (local_640 != &local_630) {
            operator_delete(local_640,local_630 + 1);
          }
          if (local_660 != local_650) {
            operator_delete(local_660,local_650[0] + 1);
          }
          if (local_620 != local_610) {
            operator_delete(local_620,local_610[0] + 1);
          }
        }
        uVar20 = local_5e8;
        puVar26 = local_5f8;
        if (local_5f8 != &local_5e8) goto LAB_00319743;
      }
      else {
        local_438._0_8_ = (char *)0x74616d00000003;
        local_620 = local_610;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"m","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
        std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
        std::ios_base::~ios_base(local_540);
        uVar20 = 0xf;
        if (local_620 != local_610) {
          uVar20 = local_610[0];
        }
        if (uVar20 < (ulong)(local_658 + local_618)) {
          uVar20 = 0xf;
          if (local_660 != local_650) {
            uVar20 = local_650[0];
          }
          if (uVar20 < (ulong)(local_658 + local_618)) goto LAB_0031935c;
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_660,0,(char *)0x0,(ulong)local_620);
        }
        else {
LAB_0031935c:
          puVar15 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_660);
        }
        plVar17 = puVar15 + 2;
        if ((long *)*puVar15 == plVar17) {
          local_630 = *plVar17;
          uStack_628 = puVar15[3];
          local_640 = &local_630;
        }
        else {
          local_630 = *plVar17;
          local_640 = (long *)*puVar15;
        }
        local_638 = puVar15[1];
        *puVar15 = plVar17;
        puVar15[1] = 0;
        *(undefined1 *)plVar17 = 0;
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_640);
        puVar26 = (ulong *)(plVar17 + 2);
        if ((ulong *)*plVar17 == puVar26) {
          local_5e8 = *puVar26;
          lStack_5e0 = plVar17[3];
          local_5f8 = &local_5e8;
        }
        else {
          local_5e8 = *puVar26;
          local_5f8 = (ulong *)*plVar17;
        }
        local_5f0 = plVar17[1];
        *plVar17 = (long)puVar26;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)
                   ((this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar28),(string *)&local_5f8);
        if (local_5f8 != &local_5e8) {
          operator_delete(local_5f8,local_5e8 + 1);
        }
        if (local_640 != &local_630) {
          operator_delete(local_640,local_630 + 1);
        }
        if (local_660 != local_650) {
          operator_delete(local_660,local_650[0] + 1);
        }
        uVar20 = local_610[0];
        puVar26 = local_620;
        if (local_620 != local_610) {
LAB_00319743:
          operator_delete(puVar26,uVar20 + 1);
        }
      }
      pMVar30 = (this_00->
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar11 = false;
      std::__cxx11::string::_M_replace
                ((ulong)&pMVar30[uVar28].shading_model,0,
                 (char *)pMVar30[uVar28].shading_model._M_string_length,0x70f555);
      aVar12 = aiGetMaterialProperty
                         ((aiMaterial *)local_600,"$mat.shadingm",0,0,
                          (aiMaterialProperty **)local_5b0);
      uVar19 = 1;
      if (aVar12 == aiReturn_SUCCESS) {
        if ((*(uint *)(local_5b0[0]._M_dataplus._M_p + 0x40c) < 4) ||
           (*(int *)(local_5b0[0]._M_dataplus._M_p + 0x410) != 5)) {
          bVar11 = false;
        }
        else {
          uVar19 = **(undefined4 **)(local_5b0[0]._M_dataplus._M_p + 0x418);
          bVar11 = true;
        }
      }
      if (bVar11) {
        switch(uVar19) {
        case 2:
          pMVar30 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar27 = &pMVar30[uVar28].shading_model;
          pcVar22 = (char *)pMVar30[uVar28].shading_model._M_string_length;
          pcVar21 = "lambert";
          break;
        case 3:
          pMVar30 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar27 = &pMVar30[uVar28].shading_model;
          pcVar22 = (char *)pMVar30[uVar28].shading_model._M_string_length;
          pcVar21 = "phong";
          break;
        case 4:
          pMVar30 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar27 = &pMVar30[uVar28].shading_model;
          pcVar22 = (char *)pMVar30[uVar28].shading_model._M_string_length;
          pcVar21 = "blinn";
          break;
        default:
          goto switchD_003197f0_caseD_5;
        case 9:
          pMVar30 = (this_00->
                    super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar27 = &pMVar30[uVar28].shading_model;
          pcVar22 = (char *)pMVar30[uVar28].shading_model._M_string_length;
          pcVar21 = "constant";
        }
        std::__cxx11::string::_M_replace((ulong)psVar27,0,pcVar22,(ulong)pcVar21);
      }
switchD_003197f0_caseD_5:
      this = local_5d8;
      pSVar3 = local_600;
      ReadMaterialSurface(local_5d8,
                          &(local_5d8->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar28].ambient,
                          (aiMaterial *)local_600,aiTextureType_AMBIENT,"$clr.ambient",0,0);
      pMVar30 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = pMVar30[uVar28].ambient.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar30[uVar28].diffuse,(aiMaterial *)pSVar3,aiTextureType_DIFFUSE,
                          "$clr.diffuse",0,0);
      pMVar30 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = pMVar30[uVar28].diffuse.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar30[uVar28].specular,(aiMaterial *)pSVar3,aiTextureType_SPECULAR
                          ,"$clr.specular",0,0);
      pMVar30 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar6 = pMVar30[uVar28].specular.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar30[uVar28].emissive,(aiMaterial *)pSVar3,aiTextureType_EMISSIVE
                          ,"$clr.emissive",0,0);
      pMVar30 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar7 = pMVar30[uVar28].emissive.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar30[uVar28].reflective,(aiMaterial *)pSVar3,
                          aiTextureType_REFLECTION,"$clr.reflective",0,0);
      pMVar30 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar8 = pMVar30[uVar28].reflective.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar30[uVar28].transparent,(aiMaterial *)pSVar3,
                          aiTextureType_OPACITY,"$clr.transparent",0,0);
      pMVar30 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar9 = pMVar30[uVar28].transparent.texture._M_string_length;
      ReadMaterialSurface(this,&pMVar30[uVar28].normal,(aiMaterial *)pSVar3,aiTextureType_NORMALS,
                          (char *)0x0,0,0);
      pMVar30 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar29 = (((((((lVar29 - (ulong)(sVar4 == 0)) - (ulong)(sVar5 == 0)) - (ulong)(sVar6 == 0)) -
                  (ulong)(sVar7 == 0)) - (ulong)(sVar8 == 0)) - (ulong)(sVar9 == 0)) + 7) -
               (ulong)(pMVar30[uVar28].normal.texture._M_string_length == 0);
      aVar12 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar3,"$mat.shininess",0,0,&pMVar30[uVar28].shininess.value
                          ,(uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar28].shininess.exist = aVar12 == aiReturn_SUCCESS
      ;
      aVar12 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar3,"$mat.opacity",0,0,
                          &(this->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar28].transparency.value,
                          (uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar28].transparency.exist =
           aVar12 == aiReturn_SUCCESS;
      aVar12 = aiGetMaterialFloatArray
                         ((aiMaterial *)pSVar3,"$mat.refracti",0,0,
                          &(this->materials).
                           super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar28].index_refraction.value,
                          (uint *)0x0);
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar28].index_refraction.exist =
           aVar12 == aiReturn_SUCCESS;
      uVar28 = uVar28 + 1;
      paVar14 = this->mScene;
      lVar25 = lVar25 + 0x218;
    } while (uVar28 < paVar14->mNumMaterials);
    if (lVar29 != 0) {
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                           (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<library_images>",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      std::__cxx11::string::append((char *)&this->startstr);
      pMVar30 = (this->materials).
                super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar30 !=
          (this->materials).
          super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar22 = local_438 + 0x10;
        do {
          pcVar10 = (pMVar30->name)._M_dataplus._M_p;
          local_438._0_8_ = pcVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,pcVar10,pcVar10 + (pMVar30->name)._M_string_length);
          std::__cxx11::string::append((char *)local_438);
          WriteImageEntry(this,&pMVar30->ambient,(string *)local_438);
          if ((char *)local_438._0_8_ != pcVar22) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
          pcVar10 = (pMVar30->name)._M_dataplus._M_p;
          local_438._0_8_ = pcVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,pcVar10,pcVar10 + (pMVar30->name)._M_string_length);
          std::__cxx11::string::append((char *)local_438);
          WriteImageEntry(this,&pMVar30->diffuse,(string *)local_438);
          if ((char *)local_438._0_8_ != pcVar22) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
          pcVar10 = (pMVar30->name)._M_dataplus._M_p;
          local_438._0_8_ = pcVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,pcVar10,pcVar10 + (pMVar30->name)._M_string_length);
          std::__cxx11::string::append((char *)local_438);
          WriteImageEntry(this,&pMVar30->specular,(string *)local_438);
          if ((char *)local_438._0_8_ != pcVar22) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
          pcVar10 = (pMVar30->name)._M_dataplus._M_p;
          local_438._0_8_ = pcVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,pcVar10,pcVar10 + (pMVar30->name)._M_string_length);
          std::__cxx11::string::append((char *)local_438);
          WriteImageEntry(this,&pMVar30->emissive,(string *)local_438);
          if ((char *)local_438._0_8_ != pcVar22) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
          pcVar10 = (pMVar30->name)._M_dataplus._M_p;
          local_438._0_8_ = pcVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,pcVar10,pcVar10 + (pMVar30->name)._M_string_length);
          std::__cxx11::string::append((char *)local_438);
          WriteImageEntry(this,&pMVar30->reflective,(string *)local_438);
          if ((char *)local_438._0_8_ != pcVar22) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
          pcVar10 = (pMVar30->name)._M_dataplus._M_p;
          local_438._0_8_ = pcVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,pcVar10,pcVar10 + (pMVar30->name)._M_string_length);
          std::__cxx11::string::append((char *)local_438);
          WriteImageEntry(this,&pMVar30->transparent,(string *)local_438);
          if ((char *)local_438._0_8_ != pcVar22) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
          pcVar10 = (pMVar30->name)._M_dataplus._M_p;
          local_438._0_8_ = pcVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_438,pcVar10,pcVar10 + (pMVar30->name)._M_string_length);
          std::__cxx11::string::append((char *)local_438);
          WriteImageEntry(this,&pMVar30->normal,(string *)local_438);
          if ((char *)local_438._0_8_ != pcVar22) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
          pMVar30 = pMVar30 + 1;
        } while (pMVar30 !=
                 (this->materials).
                 super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      PopTag(this);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&this->field_0x38,(this->startstr)._M_dataplus._M_p,
                           (this->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</library_images>",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    }
  }
  if ((this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->materials).
      super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar1 = &this->field_0x38;
    psVar27 = &this->startstr;
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<library_effects>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar27);
    pMVar30 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar30 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pProperty = &pMVar30->index_refraction;
      do {
        name_00 = (string *)(pProperty + -0x42);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<effect id=\"",0xc);
        XMLIDEncode((string *)local_438,name_00);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-fx\" name=\"",0xb);
        XMLEscape(local_5b0,name_00);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,local_5b0[0]._M_dataplus._M_p,local_5b0[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != &local_5b0[0].field_2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        std::__cxx11::string::append((char *)psVar27);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<profile_COMMON>",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar27);
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"emission","");
        local_600 = (Surface *)(pProperty + -0x22);
        WriteTextureParamEntry(this,local_600,(string *)local_438,name_00);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ambient","");
        WriteTextureParamEntry(this,(Surface *)(pProperty + -0x3a),(string *)local_438,name_00);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"diffuse","");
        local_5d8 = (ColladaExporter *)(pProperty + -0x32);
        WriteTextureParamEntry(this,(Surface *)local_5d8,(string *)local_438,name_00);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"specular","");
        local_5b8 = (Surface *)(pProperty + -0x2a);
        WriteTextureParamEntry(this,local_5b8,(string *)local_438,name_00);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"reflective","");
        local_5c0 = (Surface *)(pProperty + -0x1a);
        WriteTextureParamEntry(this,local_5c0,(string *)local_438,name_00);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"transparent","");
        pSVar3 = (Surface *)(pProperty + -0x12);
        WriteTextureParamEntry(this,pSVar3,(string *)local_438,name_00);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"normal","");
        pSurface = (Surface *)(pProperty + -10);
        WriteTextureParamEntry(this,pSurface,(string *)local_438,name_00);
        local_5d0 = pSurface;
        local_5c8 = pSVar3;
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"<technique sid=\"standard\">",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar27);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<",1);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)pProperty[-0x3e],(long)pProperty[-0x3d]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar27);
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"emission","");
        paVar2 = &local_5b0[0].field_2;
        local_5b0[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_5b0);
        WriteTextureColorEntry(this,local_600,(string *)local_438,local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ambient","");
        local_5b0[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_5b0);
        WriteTextureColorEntry(this,(Surface *)(pProperty + -0x3a),(string *)local_438,local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"diffuse","");
        local_5b0[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_5b0);
        WriteTextureColorEntry(this,(Surface *)local_5d8,(string *)local_438,local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"specular","");
        local_5b0[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_5b0);
        WriteTextureColorEntry(this,local_5b8,(string *)local_438,local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"shininess","");
        WriteFloatEntry(this,pProperty + -2,(string *)local_438);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"reflective","");
        local_5b0[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_5b0);
        WriteTextureColorEntry(this,local_5c0,(string *)local_438,local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"transparent","");
        local_5b0[0]._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,pProperty[-0x42],
                   (long)pProperty[-0x41] + (long)pProperty[-0x42]);
        std::__cxx11::string::append((char *)local_5b0);
        WriteTextureColorEntry(this,local_5c8,(string *)local_438,local_5b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != paVar2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"transparency","");
        WriteFloatEntry(this,pProperty + -1,(string *)local_438);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"index_of_refraction","");
        WriteFloatEntry(this,pProperty,(string *)local_438);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        if (pProperty[-6] != (Property)0x0) {
          local_438._0_8_ = local_438 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"bump","");
          local_5b0[0]._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_5b0,pProperty[-0x42],
                     (long)pProperty[-0x41] + (long)pProperty[-0x42]);
          std::__cxx11::string::append((char *)local_5b0);
          WriteTextureColorEntry(this,local_5d0,(string *)local_438,local_5b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b0[0]._M_dataplus._M_p != paVar2) {
            operator_delete(local_5b0[0]._M_dataplus._M_p,
                            local_5b0[0].field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
        }
        PopTag(this);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</",2);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)pProperty[-0x3e],(long)pProperty[-0x3d]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,">",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</technique>",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</profile_COMMON>",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</effect>",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        pMVar30 = (pointer)(pProperty + 1);
        pProperty = pProperty + 0x43;
      } while (pMVar30 !=
               (this->materials).
               super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    PopTag(this);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</library_effects>",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<library_materials>",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar27);
    pMVar30 = (this->materials).
              super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar30 !=
        (this->materials).
        super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<material id=\"",0xe);
        XMLIDEncode((string *)local_438,&pMVar30->name);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" name=\"",8);
        XMLEscape(local_5b0,&pMVar30->name);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,local_5b0[0]._M_dataplus._M_p,local_5b0[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != &local_5b0[0].field_2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        std::__cxx11::string::append((char *)psVar27);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<instance_effect url=\"#",0x17);
        XMLIDEncode((string *)local_438,&pMVar30->name);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)local_438._0_8_,local_438._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-fx\"/>",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        PopTag(this);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</material>",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        pMVar30 = pMVar30 + 1;
      } while (pMVar30 !=
               (this->materials).
               super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    PopTag(this);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                         (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</library_materials>",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  }
  return;
}

Assistant:

void ColladaExporter::WriteMaterials()
{
  materials.resize( mScene->mNumMaterials);

  /// collect all materials from the scene
  size_t numTextures = 0;
  for( size_t a = 0; a < mScene->mNumMaterials; ++a )
  {
    const aiMaterial* mat = mScene->mMaterials[a];

    aiString name;
    if( mat->Get( AI_MATKEY_NAME, name) != aiReturn_SUCCESS ) {
      name = "mat";
      materials[a].name = std::string( "m") + to_string(a) + name.C_Str();
    } else {
      // try to use the material's name if no other material has already taken it, else append #
      std::string testName = name.C_Str();
      size_t materialCountWithThisName = 0;
      for( size_t i = 0; i < a; i ++ ) {
        if( materials[i].name == testName ) {
          materialCountWithThisName ++;
        }
      }
      if( materialCountWithThisName == 0 ) {
        materials[a].name = name.C_Str();
      } else {
        materials[a].name = std::string(name.C_Str()) + to_string(materialCountWithThisName);
      }
    }

    aiShadingMode shading = aiShadingMode_Flat;
    materials[a].shading_model = "phong";
    if(mat->Get( AI_MATKEY_SHADING_MODEL, shading) == aiReturn_SUCCESS) {
        if(shading == aiShadingMode_Phong) {
            materials[a].shading_model = "phong";
        } else if(shading == aiShadingMode_Blinn) {
            materials[a].shading_model = "blinn";
        } else if(shading == aiShadingMode_NoShading) {
            materials[a].shading_model = "constant";
        } else if(shading == aiShadingMode_Gouraud) {
            materials[a].shading_model = "lambert";
        }
    }

    ReadMaterialSurface( materials[a].ambient, mat, aiTextureType_AMBIENT, AI_MATKEY_COLOR_AMBIENT);
    if( !materials[a].ambient.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].diffuse, mat, aiTextureType_DIFFUSE, AI_MATKEY_COLOR_DIFFUSE);
    if( !materials[a].diffuse.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].specular, mat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
    if( !materials[a].specular.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].emissive, mat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);
    if( !materials[a].emissive.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].reflective, mat, aiTextureType_REFLECTION, AI_MATKEY_COLOR_REFLECTIVE);
    if( !materials[a].reflective.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].transparent, mat, aiTextureType_OPACITY, AI_MATKEY_COLOR_TRANSPARENT);
    if( !materials[a].transparent.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].normal, mat, aiTextureType_NORMALS, NULL, 0, 0);
    if( !materials[a].normal.texture.empty() ) numTextures++;

    materials[a].shininess.exist = mat->Get( AI_MATKEY_SHININESS, materials[a].shininess.value) == aiReturn_SUCCESS;
    materials[a].transparency.exist = mat->Get( AI_MATKEY_OPACITY, materials[a].transparency.value) == aiReturn_SUCCESS;
    materials[a].index_refraction.exist = mat->Get( AI_MATKEY_REFRACTI, materials[a].index_refraction.value) == aiReturn_SUCCESS;
  }

  // output textures if present
  if( numTextures > 0 )
  {
    mOutput << startstr << "<library_images>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      WriteImageEntry( mat.ambient, mat.name + "-ambient-image");
      WriteImageEntry( mat.diffuse, mat.name + "-diffuse-image");
      WriteImageEntry( mat.specular, mat.name + "-specular-image");
      WriteImageEntry( mat.emissive, mat.name + "-emission-image");
      WriteImageEntry( mat.reflective, mat.name + "-reflective-image");
      WriteImageEntry( mat.transparent, mat.name + "-transparent-image");
      WriteImageEntry( mat.normal, mat.name + "-normal-image");
    }
    PopTag();
    mOutput << startstr << "</library_images>" << endstr;
  }

  // output effects - those are the actual carriers of information
  if( !materials.empty() )
  {
    mOutput << startstr << "<library_effects>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      // this is so ridiculous it must be right
      mOutput << startstr << "<effect id=\"" << XMLIDEncode(mat.name) << "-fx\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<profile_COMMON>" << endstr;
      PushTag();

      // write sampler- and surface params for the texture entries
      WriteTextureParamEntry( mat.emissive, "emission", mat.name);
      WriteTextureParamEntry( mat.ambient, "ambient", mat.name);
      WriteTextureParamEntry( mat.diffuse, "diffuse", mat.name);
      WriteTextureParamEntry( mat.specular, "specular", mat.name);
      WriteTextureParamEntry( mat.reflective, "reflective", mat.name);
      WriteTextureParamEntry( mat.transparent, "transparent", mat.name);
      WriteTextureParamEntry( mat.normal, "normal", mat.name);

      mOutput << startstr << "<technique sid=\"standard\">" << endstr;
      PushTag();
      mOutput << startstr << "<" << mat.shading_model << ">" << endstr;
      PushTag();

      WriteTextureColorEntry( mat.emissive, "emission", mat.name + "-emission-sampler");
      WriteTextureColorEntry( mat.ambient, "ambient", mat.name + "-ambient-sampler");
      WriteTextureColorEntry( mat.diffuse, "diffuse", mat.name + "-diffuse-sampler");
      WriteTextureColorEntry( mat.specular, "specular", mat.name + "-specular-sampler");
      WriteFloatEntry(mat.shininess, "shininess");
      WriteTextureColorEntry( mat.reflective, "reflective", mat.name + "-reflective-sampler");
      WriteTextureColorEntry( mat.transparent, "transparent", mat.name + "-transparent-sampler");
      WriteFloatEntry(mat.transparency, "transparency");
      WriteFloatEntry(mat.index_refraction, "index_of_refraction");

      if(! mat.normal.texture.empty()) {
        WriteTextureColorEntry( mat.normal, "bump", mat.name + "-normal-sampler");
      }

      PopTag();
      mOutput << startstr << "</" << mat.shading_model << ">" << endstr;
      PopTag();
      mOutput << startstr << "</technique>" << endstr;
      PopTag();
      mOutput << startstr << "</profile_COMMON>" << endstr;
      PopTag();
      mOutput << startstr << "</effect>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_effects>" << endstr;

    // write materials - they're just effect references
    mOutput << startstr << "<library_materials>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      mOutput << startstr << "<material id=\"" << XMLIDEncode(mat.name) << "\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<instance_effect url=\"#" << XMLIDEncode(mat.name) << "-fx\"/>" << endstr;
      PopTag();
      mOutput << startstr << "</material>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_materials>" << endstr;
  }
}